

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O3

bool Qentem::Digit::parseExponent<char16_t>
               (char16_t *content,SizeT32 *exponent,bool *is_negative_exp,SizeT *offset,
               SizeT end_offset)

{
  SizeT SVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = *offset;
  if (uVar4 < end_offset) {
    bVar2 = false;
    do {
      if (content[uVar4] == L'+') {
        if (bVar2) {
          return false;
        }
        *offset = uVar4 + 1;
      }
      else {
        uVar3 = uVar4;
        if (content[uVar4] != L'-') {
          while ((uVar3 < end_offset && ((ushort)(content[uVar3] + L'￐') < 10))) {
            *exponent = ((ushort)content[uVar3] - 0x30) + *exponent * 10;
            SVar1 = *offset;
            *offset = SVar1 + 1;
            uVar3 = SVar1 + 1;
          }
          return uVar4 != uVar3;
        }
        if (bVar2) {
          return false;
        }
        *offset = uVar4 + 1;
        *is_negative_exp = true;
      }
      uVar4 = uVar4 + 1;
      bVar2 = true;
    } while (uVar4 < end_offset);
  }
  return false;
}

Assistant:

static bool parseExponent(const Char_T *content, SizeT32 &exponent, bool &is_negative_exp, SizeT &offset,
                              const SizeT end_offset) noexcept {
        bool sign_set{false};

        while (offset < end_offset) {
            switch (content[offset]) {
                case DigitUtils::DigitChar::Positive: {
                    if (!sign_set) {
                        ++offset;
                        sign_set = true;
                        break;
                    }

                    return false;
                }
                case DigitUtils::DigitChar::Negative: {
                    if (!sign_set) {
                        ++offset;
                        is_negative_exp = true;
                        sign_set        = true;
                        break;
                    }

                    return false;
                }

                default: {
                    const SizeT o_offset = offset;

                    while (offset < end_offset) {
                        const Char_T digit = content[offset];

                        if ((digit >= DigitUtils::DigitChar::Zero) && (digit <= DigitUtils::DigitChar::Nine)) {
                            exponent *= SizeT32{10};
                            exponent += SizeT32(digit - DigitUtils::DigitChar::Zero);
                            ++offset;
                            continue;
                        }

                        break;
                    }

                    return (o_offset != offset);
                }
            }
        }

        return false;
    }